

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_fence(void)

{
  int proc;
  Integer in_stack_00000198;
  char *in_stack_000001a0;
  int local_4;
  
  if (GA_fence_set < 1) {
    pnga_error(in_stack_000001a0,in_stack_00000198);
  }
  GA_fence_set = GA_fence_set + -1;
  for (local_4 = 0; local_4 < GAnproc; local_4 = local_4 + 1) {
    if (fence_array[local_4] != '\0') {
      ARMCI_Fence(0);
    }
  }
  memset(fence_array,0,(long)(int)GAnproc);
  return;
}

Assistant:

void pnga_fence()
{
    int proc;
    if(GA_fence_set<1)pnga_error("ga_fence: fence not initialized",0);
    GA_fence_set--;
    for(proc=0;proc<GAnproc;proc++)if(fence_array[proc])ARMCI_Fence(proc);
    bzero(fence_array,(int)GAnproc);
}